

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<const_std::tuple<TestFunction,_int>_&> *
testing::A<std::tuple<TestFunction,int>const&>(void)

{
  MatcherInterface<const_std::tuple<TestFunction,_int>_&> *pMVar1;
  Matcher<const_std::tuple<TestFunction,_int>_&> *in_RDI;
  
  pMVar1 = (MatcherInterface<const_std::tuple<TestFunction,_int>_&> *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_002bba10;
  (in_RDI->super_MatcherBase<const_std::tuple<TestFunction,_int>_&>).impl_.value_ = pMVar1;
  (in_RDI->super_MatcherBase<const_std::tuple<TestFunction,_int>_&>).impl_.link_.next_ =
       &(in_RDI->super_MatcherBase<const_std::tuple<TestFunction,_int>_&>).impl_.link_;
  (in_RDI->super_MatcherBase<const_std::tuple<TestFunction,_int>_&>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002bb9d8;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }